

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.h
# Opt level: O0

void __thiscall
GlobalBailOutRecordDataTable::
IterateGlobalBailOutRecordTableRows<BailOutRecord::RestoreValues(IR::BailOutKind,Js::JavascriptCallStackLayout*,Js::InterpreterStackFrame*,Js::ScriptContext*,bool,void**,BailOutRecord::BailOutReturnValue*,void**,void*,void*,bool,void*)const::__0>
          (GlobalBailOutRecordDataTable *this,uint32 bailOutRecordId,
          anon_class_32_4_9e2aaefe callback)

{
  uint local_18;
  uint i;
  uint32 bailOutRecordId_local;
  GlobalBailOutRecordDataTable *this_local;
  
  local_18 = 0;
  do {
    if (this->length <= local_18) {
      return;
    }
    if (bailOutRecordId <= this->globalBailOutRecordDataRows[local_18].end) {
      if (bailOutRecordId < this->globalBailOutRecordDataRows[local_18].start) {
        return;
      }
      BailOutRecord::RestoreValues::anon_class_32_4_9e2aaefe::operator()
                (&callback,this->globalBailOutRecordDataRows + local_18);
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void IterateGlobalBailOutRecordTableRows(uint32 bailOutRecordId, Fn callback)
    {
        // Visit all the rows that have this bailout ID in their range.
        for (uint i = 0; i < this->length; i++)
        {
            if (bailOutRecordId > globalBailOutRecordDataRows[i].end)
            {
                // Not in range.
                continue;
            }

            if (globalBailOutRecordDataRows[i].start > bailOutRecordId)
            {
                // Not in range, and we know there are no more in range (since the table is sorted by "start").
                return;
            }

            // In range: take action.
            callback(&globalBailOutRecordDataRows[i]);
        }
    }